

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolorspace.cpp
# Opt level: O1

PrimaryPoints *
QColorSpace::PrimaryPoints::fromPrimaries(PrimaryPoints *__return_storage_ptr__,Primaries primaries)

{
  qreal qVar1;
  qreal qVar2;
  qreal qVar3;
  qreal qVar4;
  qreal qVar5;
  qreal qVar6;
  qreal qVar7;
  long lVar8;
  
  (__return_storage_ptr__->redPoint).xp = 0.0;
  (__return_storage_ptr__->redPoint).yp = 0.0;
  (__return_storage_ptr__->greenPoint).xp = 0.0;
  (__return_storage_ptr__->greenPoint).yp = 0.0;
  (__return_storage_ptr__->bluePoint).xp = 0.0;
  (__return_storage_ptr__->bluePoint).yp = 0.0;
  (__return_storage_ptr__->whitePoint).xp = 0.0;
  (__return_storage_ptr__->whitePoint).yp = 0.0;
  lVar8 = (long)(int)primaries;
  qVar1 = *(qreal *)(&DAT_006a92f0 + lVar8 * 8);
  qVar2 = *(qreal *)(&DAT_006a9318 + lVar8 * 8);
  qVar3 = *(qreal *)(&DAT_006a9340 + lVar8 * 8);
  qVar4 = *(qreal *)(&DAT_006a9368 + lVar8 * 8);
  qVar5 = *(qreal *)(&DAT_006a9390 + lVar8 * 8);
  qVar6 = *(qreal *)(&DAT_006a93b8 + lVar8 * 8);
  qVar7 = *(qreal *)(&DAT_006a93e0 + lVar8 * 8);
  (__return_storage_ptr__->redPoint).xp =
       *(qreal *)(qt_staticMetaObjectStaticContent<(anonymous_namespace)::qt_meta_tag_ZN11QColorSpaceE_t>
                  .strings + lVar8 * 8 + 0x100);
  (__return_storage_ptr__->redPoint).yp = qVar1;
  (__return_storage_ptr__->greenPoint).xp = qVar2;
  (__return_storage_ptr__->greenPoint).yp = qVar3;
  (__return_storage_ptr__->bluePoint).xp = qVar4;
  (__return_storage_ptr__->bluePoint).yp = qVar5;
  (__return_storage_ptr__->whitePoint).xp = qVar6;
  (__return_storage_ptr__->whitePoint).yp = qVar7;
  return __return_storage_ptr__;
}

Assistant:

QColorSpace::PrimaryPoints QColorSpace::PrimaryPoints::fromPrimaries(Primaries primaries)
{
    PrimaryPoints out;
    switch (primaries) {
    case Primaries::SRgb:
        out.redPoint   = QPointF(0.640, 0.330);
        out.greenPoint = QPointF(0.300, 0.600);
        out.bluePoint  = QPointF(0.150, 0.060);
        out.whitePoint = QColorVector::D65Chromaticity();
        break;
    case Primaries::DciP3D65:
        out.redPoint   = QPointF(0.680, 0.320);
        out.greenPoint = QPointF(0.265, 0.690);
        out.bluePoint  = QPointF(0.150, 0.060);
        out.whitePoint = QColorVector::D65Chromaticity();
        break;
    case Primaries::AdobeRgb:
        out.redPoint   = QPointF(0.640, 0.330);
        out.greenPoint = QPointF(0.210, 0.710);
        out.bluePoint  = QPointF(0.150, 0.060);
        out.whitePoint = QColorVector::D65Chromaticity();
        break;
    case Primaries::ProPhotoRgb:
        out.redPoint   = QPointF(0.7347, 0.2653);
        out.greenPoint = QPointF(0.1596, 0.8404);
        out.bluePoint  = QPointF(0.0366, 0.0001);
        out.whitePoint = QColorVector::D50Chromaticity();
        break;
    case Primaries::Bt2020:
        out.redPoint   = QPointF(0.708, 0.292);
        out.greenPoint = QPointF(0.170, 0.797);
        out.bluePoint  = QPointF(0.131, 0.046);
        out.whitePoint = QColorVector::D65Chromaticity();
        break;
    default:
        Q_UNREACHABLE();
    }
    return out;
}